

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushReceiverVariable::encode(PushReceiverVariable *this,uint8_t *buffer)

{
  uint8_t *puVar1;
  uint8_t *buffer_local;
  PushReceiverVariable *this_local;
  
  if (((this->longInstruction & 1U) == 0) && (this->index < 0x10)) {
    this_local = (PushReceiverVariable *)(buffer + 1);
    *buffer = (uint8_t)this->index;
  }
  else {
    puVar1 = InstructionNode::encodeExtA
                       (&this->super_InstructionNode,buffer,(long)(this->index / 0x100));
    *puVar1 = 0xe2;
    this_local = (PushReceiverVariable *)(puVar1 + 2);
    puVar1[1] = (uint8_t)(this->index % 0x100);
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(!longInstruction && index < BytecodeSet::PushReceiverVariableShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushReceiverVariableShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);

		*buffer++ = BytecodeSet::PushReceiverVariable;
		*buffer++ = index % 256;
		return buffer;
	}